

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzellipse3d.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZEllipse3D::GradX<double>
          (TPZEllipse3D *this,TPZFMatrix<double> *cornerco,TPZVec<double> *par,
          TPZFMatrix<double> *gradx)

{
  double *pdVar1;
  TPZFMatrix<double> *this_00;
  TPZVec<double> *in_RDX;
  long in_RDI;
  double dVar2;
  double col;
  double dVar3;
  double dVar4;
  _func_int **rows;
  int i_1;
  int j;
  int i;
  TPZFMatrix<double> axloc;
  int transp;
  TPZFNMatrix<3,_double> dxcoglob;
  TPZFNMatrix<3,_double> dxcoloc;
  double angle;
  double dangledqsi;
  REAL delangle;
  int64_t in_stack_fffffffffffffd30;
  double *in_stack_fffffffffffffd38;
  TPZFMatrix<double> *in_stack_fffffffffffffd40;
  double *in_stack_fffffffffffffd48;
  int64_t in_stack_fffffffffffffd50;
  int64_t in_stack_fffffffffffffd58;
  TPZFNMatrix<3,_double> *in_stack_fffffffffffffd60;
  int local_254;
  int local_250;
  int local_24c;
  int in_stack_fffffffffffffe24;
  double in_stack_fffffffffffffe28;
  double in_stack_fffffffffffffe30;
  TPZFMatrix<double> *in_stack_fffffffffffffe38;
  TPZFMatrix<double> *in_stack_fffffffffffffe40;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe4c;
  TPZFMatrix<double> *in_stack_fffffffffffffe50;
  
  dVar2 = *(double *)(in_RDI + 0x148) - *(double *)(in_RDI + 0x140);
  col = dVar2 * 0.5;
  dVar3 = *(double *)(in_RDI + 0x140);
  pdVar1 = TPZVec<double>::operator[](in_RDX,0);
  dVar3 = (*pdVar1 + 1.0) * 0.5 * dVar2 + dVar3;
  TPZFNMatrix<3,_double>::TPZFNMatrix
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48);
  TPZFNMatrix<3,_double>::TPZFNMatrix
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48);
  dVar2 = *(double *)(in_RDI + 0x18);
  dVar4 = sin(dVar3);
  pdVar1 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                      in_stack_fffffffffffffd30);
  *pdVar1 = -dVar2 * dVar4;
  dVar2 = *(double *)(in_RDI + 0x20);
  dVar3 = cos(dVar3);
  rows = (_func_int **)(dVar2 * dVar3);
  this_00 = (TPZFMatrix<double> *)
            TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                       in_stack_fffffffffffffd30);
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = rows;
  uVar5 = 1;
  TPZFMatrix<double>::TPZFMatrix(this_00,(int64_t)rows,(int64_t)dVar2);
  for (local_24c = 0; local_24c < 3; local_24c = local_24c + 1) {
    for (local_250 = 0; local_250 < 3; local_250 = local_250 + 1) {
      in_stack_fffffffffffffd40 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::GetVal
                     ((TPZFMatrix<double> *)(in_RDI + 0x28),(long)local_24c,(long)local_250);
      pdVar1 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd30);
      *pdVar1 = (double)in_stack_fffffffffffffd40;
    }
  }
  TPZFMatrix<double>::MultAdd
            (in_stack_fffffffffffffe50,
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffe4c,uVar5),
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe28,in_stack_fffffffffffffe24);
  for (local_254 = 0; local_254 < 3; local_254 = local_254 + 1) {
    dVar2 = col;
    in_stack_fffffffffffffd38 =
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,(int64_t)col);
    dVar3 = *in_stack_fffffffffffffd38;
    pdVar1 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd40,(int64_t)in_stack_fffffffffffffd38,(int64_t)dVar2)
    ;
    *pdVar1 = dVar2 * dVar3;
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x173e615);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x173e622);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x173e62f);
  return;
}

Assistant:

void TPZEllipse3D::GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
{
    REAL delangle = fAngleFinal - fAngleIni;
    T dangledqsi = 1./2.*delangle;
    T angle = fAngleIni + (par[0]+1.)/2.*delangle;
    TPZFNMatrix<3,T> dxcoloc(3,1,0.),dxcoglob(3,1,0.);
    dxcoloc(0,0) = -fsAxeX*sin(angle);
    dxcoloc(1,0) = fsAxeY*cos(angle);
    int transp = 1;
    TPZFMatrix<T> axloc(3,3);
    for (int i=0; i<3; i++) {
        for (int j=0; j<3; j++) {
            axloc(i,j) = fAxes.GetVal(i,j);
        }
    }
    axloc.MultAdd(dxcoloc, dxcoloc, dxcoglob,1.,0.,transp);
    for (int i=0; i<3; i++) {
        gradx(i,0) = dangledqsi*dxcoglob(i,0);
    }

}